

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContinuumPlasticVonMises::ComputePlasticStrainFlow
          (ChContinuumPlasticVonMises *this,ChStrainTensor<double> *mplasticstrainflow,
          ChStrainTensor<double> *mtotstrain)

{
  double dVar1;
  ChVoightTensor<double> mdev;
  double local_80;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_78;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_58 [56];
  
  dVar1 = ChVoightTensor<double>::GetEquivalentVonMises(&mtotstrain->super_ChVoightTensor<double>);
  if (this->elastic_yeld < dVar1) {
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero(local_58);
    ChVoightTensor<double>::GetDeviatoricPart
              (&mtotstrain->super_ChVoightTensor<double>,(ChVoightTensor<double> *)local_58);
    local_80 = (dVar1 - this->elastic_yeld) / dVar1;
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
              (&local_78,(MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_58,&local_80);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>>
              ((Matrix<double,_6,_1,_0,_6,_1> *)mplasticstrainflow,&local_78);
    return;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)mplasticstrainflow);
  return;
}

Assistant:

void ChContinuumPlasticVonMises::ComputePlasticStrainFlow(ChStrainTensor<>& mplasticstrainflow,
                                                          const ChStrainTensor<>& mtotstrain) const {
    double vonm = mtotstrain.GetEquivalentVonMises();
    if (vonm > this->elastic_yeld) {
        ChVoightTensor<> mdev;
        mtotstrain.GetDeviatoricPart(mdev);
        mplasticstrainflow = mdev * ((vonm - this->elastic_yeld) / (vonm));
    } else {
        mplasticstrainflow.setZero();
    }
}